

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,Array *array)

{
  ostream *poVar1;
  
  std::operator<<(this->os,"(array ");
  print(this,&array->element);
  poVar1 = std::operator<<(this->os,')');
  return poVar1;
}

Assistant:

std::ostream& TypePrinter::print(const Array& array) {
  os << "(array ";
  print(array.element);
  return os << ')';
}